

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteFlat<int,duckdb::string_t,duckdb::UnaryOperatorWrapper,duckdb::ChrOperator>
               (int *ldata,string_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ulong uVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  uint uVar5;
  int *piVar6;
  undefined4 uVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  idx_t *piVar9;
  ulong uVar10;
  ulong uVar11;
  idx_t iVar12;
  ulong uVar13;
  char *pcVar14;
  char c [5];
  int utf8_bytes;
  idx_t local_98;
  uint local_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  char **local_70;
  idx_t local_68;
  ValidityMask *local_60;
  int *local_58;
  ulong local_50;
  ulong local_48;
  int *local_40;
  ulong local_38;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_60 = mask;
  local_58 = ldata;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      local_70 = &(result_data->value).pointer.ptr;
      iVar12 = 0;
      do {
        local_98 = local_98 & 0xffffff0000000000;
        ChrOperator::GetCodepoint(local_58[iVar12],(char *)&local_98,(int *)&local_8c);
        uVar5 = local_8c;
        if ((ulong)local_8c < 0xd) {
          uStack_80 = 0;
          local_88 = 0;
          uStack_84 = 0;
          if (local_8c == 0) {
            uVar7 = 0;
            piVar9 = (idx_t *)(char *)0x0;
          }
          else {
            switchD_00b03519::default(&local_88,&local_98,(ulong)local_8c);
            piVar9 = (idx_t *)CONCAT44(uStack_80,uStack_84);
            uVar7 = local_88;
          }
        }
        else {
          piVar9 = &local_98;
          uVar7 = (undefined4)local_98;
        }
        ((anon_struct_16_3_d7536bce_for_pointer *)(local_70 + -1))->length = uVar5;
        *(undefined4 *)((long)local_70 + -4) = uVar7;
        *local_70 = (char *)piVar9;
        iVar12 = iVar12 + 1;
        local_70 = local_70 + 2;
      } while (count != iVar12);
    }
  }
  else {
    local_70 = (char **)result_data;
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_98 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_88,(unsigned_long **)mask,&local_98);
      peVar3 = (element_type *)CONCAT44(uStack_84,local_88);
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_7c,uStack_80);
      local_88 = 0;
      uStack_84 = 0;
      uStack_80 = 0;
      uStack_7c = 0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar3;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var4;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_7c,uStack_80) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_7c,uStack_80));
        }
      }
      pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar8->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar1;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      local_50 = count + 0x3f >> 6;
      local_70 = (char **)((((anon_union_16_2_67f50693_for_value *)local_70)->inlined).inlined + 4);
      local_48 = 0;
      uVar13 = 0;
      local_68 = count;
      do {
        piVar6 = local_58;
        puVar1 = (local_60->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar10 = uVar13 + 0x40;
          if (count <= uVar13 + 0x40) {
            uVar10 = count;
          }
LAB_0105de32:
          uVar11 = uVar13;
          if (uVar13 < uVar10) {
            pcVar14 = (char *)((long)local_70 + uVar13 * 0x10);
            do {
              local_98 = local_98 & 0xffffff0000000000;
              ChrOperator::GetCodepoint(piVar6[uVar13],(char *)&local_98,(int *)&local_8c);
              uVar5 = local_8c;
              if ((ulong)local_8c < 0xd) {
                uStack_80 = 0;
                local_88 = 0;
                uStack_84 = 0;
                if (local_8c == 0) {
                  uVar7 = 0;
                  piVar9 = (idx_t *)(undefined1 *)0x0;
                }
                else {
                  switchD_00b03519::default(&local_88,&local_98,(ulong)local_8c);
                  piVar9 = (idx_t *)CONCAT44(uStack_80,uStack_84);
                  uVar7 = local_88;
                }
              }
              else {
                piVar9 = &local_98;
                uVar7 = (undefined4)local_98;
              }
              ((anon_struct_16_2_cfc5f80c_for_inlined *)(pcVar14 + -8))->length = uVar5;
              *(undefined4 *)(pcVar14 + -4) = uVar7;
              *(idx_t **)pcVar14 = piVar9;
              uVar13 = uVar13 + 1;
              pcVar14 = pcVar14 + 0x10;
              uVar11 = uVar10;
              count = local_68;
            } while (uVar10 != uVar13);
          }
        }
        else {
          uVar2 = puVar1[local_48];
          uVar10 = uVar13 + 0x40;
          if (count <= uVar13 + 0x40) {
            uVar10 = count;
          }
          uVar11 = uVar10;
          count = local_68;
          if (uVar2 != 0) {
            if (uVar2 == 0xffffffffffffffff) goto LAB_0105de32;
            local_38 = uVar10 - uVar13;
            uVar11 = uVar13;
            if (uVar13 <= uVar10 && local_38 != 0) {
              local_40 = local_58 + uVar13;
              pcVar14 = (char *)((long)local_70 + uVar13 * 0x10);
              uVar13 = 0;
              do {
                if ((uVar2 >> (uVar13 & 0x3f) & 1) != 0) {
                  local_98 = local_98 & 0xffffff0000000000;
                  ChrOperator::GetCodepoint(local_40[uVar13],(char *)&local_98,(int *)&local_8c);
                  uVar5 = local_8c;
                  if ((ulong)local_8c < 0xd) {
                    uStack_80 = 0;
                    local_88 = 0;
                    uStack_84 = 0;
                    if (local_8c == 0) {
                      uVar7 = 0;
                      piVar9 = (idx_t *)(undefined1 *)0x0;
                    }
                    else {
                      switchD_00b03519::default(&local_88,&local_98,(ulong)local_8c);
                      piVar9 = (idx_t *)CONCAT44(uStack_80,uStack_84);
                      uVar7 = local_88;
                    }
                  }
                  else {
                    piVar9 = &local_98;
                    uVar7 = (undefined4)local_98;
                  }
                  ((anon_struct_16_2_cfc5f80c_for_inlined *)(pcVar14 + -8))->length = uVar5;
                  *(undefined4 *)(pcVar14 + -4) = uVar7;
                  *(idx_t **)pcVar14 = piVar9;
                }
                uVar13 = uVar13 + 1;
                pcVar14 = pcVar14 + 0x10;
                uVar11 = uVar10;
                count = local_68;
              } while (local_38 != uVar13);
            }
          }
        }
        local_48 = local_48 + 1;
        uVar13 = uVar11;
      } while (local_48 != local_50);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}